

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ConstantPaddingLayerParams::ByteSizeLong(ConstantPaddingLayerParams *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  int value;
  
  sVar1 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->padamounts_);
  if (sVar1 == 0) {
    value = 0;
    lVar3 = 0;
  }
  else {
    value = (int)sVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar3 = sVar2 + 1;
  }
  this->_padamounts_cached_byte_size_ = value;
  sVar2 = lVar3 + 5 + sVar1;
  sVar1 = lVar3 + sVar1;
  if (this->value_ != 0.0) {
    sVar1 = sVar2;
  }
  if (NAN(this->value_)) {
    sVar1 = sVar2;
  }
  sVar2 = sVar1 + 2;
  if (this->padtogivenoutputsizemode_ == false) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t ConstantPaddingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConstantPaddingLayerParams)
  size_t total_size = 0;

  // repeated uint64 padAmounts = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->padamounts_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _padamounts_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->padtogivenoutputsizemode() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}